

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O3

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxFrame[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  size_t *psVar3;
  long lVar4;
  ulong uVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x50),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x50),0) | 8;
  }
  psVar2 = (size_t *)operator_new__(uVar5);
  *psVar2 = n;
  if (n != 0) {
    psVar3 = psVar2 + 7;
    lVar4 = n * 0x50;
    do {
      psVar3[-6] = (size_t)(psVar3 + -4);
      psVar3[-5] = 0;
      *(undefined1 *)(psVar3 + -4) = 0;
      psVar3[-2] = (size_t)psVar3;
      psVar3[-1] = 0;
      *(undefined1 *)psVar3 = 0;
      *(undefined1 *)(psVar3 + 2) = 0;
      *(undefined4 *)((long)psVar3 + 0x14) = 0;
      psVar3[3] = 0;
      psVar3 = psVar3 + 10;
      lVar4 = lVar4 + -0x50;
    } while (lVar4 != 0);
  }
  *(size_t **)this = psVar2 + 1;
  return (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }